

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrShaderProgram.cpp
# Opt level: O1

void __thiscall sglr::ShaderProgram::~ShaderProgram(ShaderProgram *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pVVar3;
  
  (this->super_VertexShader)._vptr_VertexShader = (_func_int **)&PTR___cxa_pure_virtual_021cfca0;
  (this->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&DAT_021cfcd8;
  (this->super_FragmentShader)._vptr_FragmentShader = (_func_int **)&DAT_021cfcf0;
  pcVar2 = (this->m_geomSrc)._M_dataplus._M_p;
  paVar1 = &(this->m_geomSrc).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_fragSrc)._M_dataplus._M_p;
  paVar1 = &(this->m_fragSrc).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_vertSrc)._M_dataplus._M_p;
  paVar1 = &(this->m_vertSrc).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>::~vector(&this->m_uniforms);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_attributeNames);
  rr::FragmentShader::~FragmentShader(&this->super_FragmentShader);
  (this->super_GeometryShader)._vptr_GeometryShader = (_func_int **)&PTR___cxa_pure_virtual_021cfd60
  ;
  pVVar3 = (this->super_GeometryShader).m_outputs.
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pVVar3 != (pointer)0x0) {
    operator_delete(pVVar3,(long)(this->super_GeometryShader).m_outputs.
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar3);
  }
  pVVar3 = (this->super_GeometryShader).m_inputs.
           super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pVVar3 != (pointer)0x0) {
    operator_delete(pVVar3,(long)(this->super_GeometryShader).m_inputs.
                                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar3);
  }
  rr::VertexShader::~VertexShader(&this->super_VertexShader);
  return;
}

Assistant:

ShaderProgram::~ShaderProgram (void)
{
}